

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_CopyRectOut_Test::TestBody(Image_CopyRectOut_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Point2i p;
  WrapMode2D wrapMode;
  Point2i p_00;
  Point2i res_00;
  span<float> buf_00;
  Allocator alloc;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  bool bVar1;
  int *piVar2;
  char *expected_predicate_value;
  Bounds2iIterator BVar3;
  Bounds2iIterator BVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  int c_1;
  Bounds2iIterator pIter;
  iterator bufIter;
  vector<float,_std::allocator<float>_> buf;
  Bounds2i extent;
  int c;
  int x;
  int y;
  iterator origIter;
  Image image;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  int nc;
  PixelFormat format;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<pbrt::PixelFormat> *__range1;
  Point2i res;
  value_type *in_stack_fffffffffffffb68;
  initializer_list<pbrt::PixelFormat> *in_stack_fffffffffffffb70;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb78;
  Bounds2iIterator *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  Float in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  allocator_type *in_stack_fffffffffffffb98;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffba0;
  undefined6 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbae;
  undefined1 in_stack_fffffffffffffbaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbb0;
  char *actual_predicate_value;
  Float in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  Image *in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbf0;
  WrapMode WVar5;
  WrapMode WVar6;
  int iVar7;
  int iVar8;
  int in_stack_fffffffffffffc04;
  int in_stack_fffffffffffffc08;
  PixelFormat in_stack_fffffffffffffc0c;
  string *local_3b0;
  Bounds2i *extent_00;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffc70;
  Bounds2i *in_stack_fffffffffffffc78;
  Bounds2iIterator BVar9;
  ColorEncodingHandle *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  PixelFormat in_stack_fffffffffffffc8c;
  Image *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  int in_stack_fffffffffffffca0;
  Float in_stack_fffffffffffffca4;
  size_t in_stack_fffffffffffffca8;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffcb0;
  string local_340 [48];
  float *local_310;
  AssertionResult local_308;
  int local_2f4;
  Bounds2iIterator local_2f0;
  Bounds2iIterator local_2e0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_2d0 [2];
  span<float> local_2c0;
  char local_2a9 [69];
  int local_264;
  int local_260;
  WrapMode local_25c;
  iterator local_258;
  value_type *local_250;
  Tuple2<pbrt::Point2,_int> local_230;
  allocator<char> local_109;
  string local_108 [36];
  int local_e4;
  undefined1 local_dd;
  undefined1 local_c9 [41];
  undefined1 *local_a0;
  undefined8 local_98;
  Tuple2<pbrt::Point2,_int> local_78;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_70;
  int local_50;
  PixelFormat local_4c;
  const_iterator local_48;
  const_iterator local_40;
  PixelFormat local_34 [3];
  initializer_list<pbrt::PixelFormat> local_28;
  initializer_list<pbrt::PixelFormat> *local_18;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffffb70,
             (int)((ulong)in_stack_fffffffffffffb68 >> 0x20),(int)in_stack_fffffffffffffb68);
  local_34[0] = U256;
  local_34[1] = 1;
  local_34[2] = 2;
  local_28._M_array = local_34;
  local_28._M_len = 3;
  local_18 = &local_28;
  local_40 = std::initializer_list<pbrt::PixelFormat>::begin(local_18);
  local_48 = std::initializer_list<pbrt::PixelFormat>::end(in_stack_fffffffffffffb70);
  BVar9.bounds = in_stack_fffffffffffffc78;
  BVar9.p.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffc70;
  BVar4.bounds = (Bounds2i *)in_stack_fffffffffffffb70;
  BVar4.p.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffb78;
  do {
    if (local_40 == local_48) {
      return;
    }
    local_4c = *local_40;
    for (local_50 = 1; local_50 < 4; local_50 = local_50 + 1) {
      local_78 = local_10[0];
      res_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffc0c;
      res_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffc08;
      GetFloatPixels(res_00,in_stack_fffffffffffffc04);
      local_dd = 1;
      local_c9._1_8_ = local_c9 + 9;
      extent_00 = (Bounds2i *)local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbb0,
                 (char *)CONCAT17(in_stack_fffffffffffffbaf,
                                  CONCAT16(in_stack_fffffffffffffbae,in_stack_fffffffffffffba8)),
                 (allocator<char> *)in_stack_fffffffffffffba0);
      local_dd = 0;
      local_a0 = local_c9 + 9;
      local_98 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x5c0ce5);
      __l._M_array._6_1_ = in_stack_fffffffffffffbae;
      __l._M_array._0_6_ = in_stack_fffffffffffffba8;
      __l._M_array._7_1_ = in_stack_fffffffffffffbaf;
      __l._M_len = (size_type)in_stack_fffffffffffffbb0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffba0,__l,in_stack_fffffffffffffb98);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x5c0d19);
      local_3b0 = (string *)&local_a0;
      do {
        local_3b0 = local_3b0 + -0x20;
        std::__cxx11::string::~string(local_3b0);
      } while (local_3b0 != (string *)(local_c9 + 9));
      std::allocator<char>::~allocator((allocator<char> *)local_c9);
      for (local_e4 = 1; local_e4 < local_50; local_e4 = local_e4 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                   CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                   (char)((ulong)in_stack_fffffffffffffb80 >> 0x38),
                   (allocator<char> *)
                   BVar4.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)BVar4.bounds,in_stack_fffffffffffffb68);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator(&local_109);
      }
      local_230 = local_10[0];
      in_stack_fffffffffffffc0c = local_4c;
      pstd::span<std::__cxx11::string_const>::
      span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffb80,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)BVar4.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>);
      pbrt::ColorEncodingHandle::ColorEncodingHandle
                ((ColorEncodingHandle *)BVar4.bounds,
                 (ColorEncodingHandle *)in_stack_fffffffffffffb68);
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)BVar4.bounds);
      channels.ptr._4_4_ = in_stack_fffffffffffffca4;
      channels.ptr._0_4_ = in_stack_fffffffffffffca0;
      channels.n = in_stack_fffffffffffffca8;
      alloc.memoryResource._4_4_ = in_stack_fffffffffffffc9c;
      alloc.memoryResource._0_4_ = in_stack_fffffffffffffc98;
      in_stack_fffffffffffffb68 = local_250;
      pbrt::Image::Image(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                         (Point2i)in_stack_fffffffffffffcb0,channels,in_stack_fffffffffffffc80,alloc
                        );
      local_258 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::begin(&local_70);
      iVar8 = (int)local_258;
      in_stack_fffffffffffffc04 = (int)((ulong)local_258 >> 0x20);
      local_25c = Repeat;
      while( true ) {
        WVar5 = local_25c;
        piVar2 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1);
        WVar6 = (WrapMode)piVar2;
        iVar7 = (int)((ulong)piVar2 >> 0x20);
        if (*piVar2 <= (int)WVar5) break;
        local_260 = 0;
        while( true ) {
          in_stack_fffffffffffffbe4 = local_260;
          in_stack_fffffffffffffbe8 =
               (Image *)pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          if ((int)in_stack_fffffffffffffbe8->format <= in_stack_fffffffffffffbe4) break;
          for (local_264 = 0; local_264 < local_50; local_264 = local_264 + 1) {
            pbrt::Point2<int>::Point2
                      (&(BVar4.bounds)->pMin,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                       (int)in_stack_fffffffffffffb68);
            p.super_Tuple2<pbrt::Point2,_int>.y = WVar5;
            p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffbf0;
            pbrt::Image::SetChannel
                      (in_stack_fffffffffffffbe8,p,in_stack_fffffffffffffbe4,
                       in_stack_fffffffffffffbe0);
            local_258 = local_258 + 1;
          }
          local_260 = local_260 + 1;
        }
        local_25c = local_25c + Black;
      }
      pbrt::Point2<int>::Point2
                (&(BVar4.bounds)->pMin,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                 (int)in_stack_fffffffffffffb68);
      pbrt::Point2<int>::Point2
                (&(BVar4.bounds)->pMin,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                 (int)in_stack_fffffffffffffb68);
      pbrt::Bounds2<int>::Bounds2
                ((Bounds2<int> *)in_stack_fffffffffffffb80,
                 (Point2<int> *)
                 BVar4.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>,
                 &(BVar4.bounds)->pMin);
      in_stack_fffffffffffffbe0 = (Float)pbrt::Bounds2<int>::Area(BVar4.bounds);
      expected_predicate_value = (char *)(long)((int)in_stack_fffffffffffffbe0 * local_50);
      actual_predicate_value = local_2a9;
      std::allocator<float>::allocator((allocator<float> *)0x5c122a);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 (allocator_type *)in_stack_fffffffffffffb80);
      std::allocator<float>::~allocator((allocator<float> *)0x5c1250);
      local_2c0 = pstd::MakeSpan<std::vector<float,_std::allocator<float>_>_>
                            ((vector<float,_std::allocator<float>_> *)BVar4.bounds);
      pbrt::WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffb80,BVar4.p.super_Tuple2<pbrt::Point2,_int>.y);
      buf_00.n._0_4_ = in_stack_fffffffffffffc88;
      buf_00.ptr = (float *)in_stack_fffffffffffffc80;
      buf_00.n._4_4_ = in_stack_fffffffffffffc8c;
      pbrt::Image::CopyRectOut
                ((Image *)BVar9.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>,
                 extent_00,buf_00,(WrapMode2D)BVar9.bounds);
      local_2d0[0]._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb68);
      BVar3 = pbrt::begin((Bounds2i *)0x5c12d2);
      local_2e0 = BVar3;
      while( true ) {
        BVar3 = pbrt::end(BVar4.bounds);
        in_stack_fffffffffffffbb0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)BVar3.bounds;
        local_2f0 = BVar3;
        in_stack_fffffffffffffbaf =
             pbrt::Bounds2iIterator::operator!=
                       (in_stack_fffffffffffffb80,
                        (Bounds2iIterator *)
                        BVar4.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>);
        if (!(bool)in_stack_fffffffffffffbaf) break;
        for (local_2f4 = 0; local_2f4 < local_50; local_2f4 = local_2f4 + 1) {
          local_310 = (float *)std::vector<float,_std::allocator<float>_>::end
                                         ((vector<float,_std::allocator<float>_> *)
                                          in_stack_fffffffffffffb68);
          __gnu_cxx::operator==
                    ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                     BVar4.bounds,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                     in_stack_fffffffffffffb68);
          testing::AssertionResult::AssertionResult
                    ((AssertionResult *)BVar4.bounds,
                     SUB81((ulong)in_stack_fffffffffffffb68 >> 0x38,0));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
          in_stack_fffffffffffffbae = bVar1;
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffba0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)in_stack_fffffffffffffbe8,
                       (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       actual_predicate_value,expected_predicate_value);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffba0,
                       (Type)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb8c,(char *)in_stack_fffffffffffffb80);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(WVar5,in_stack_fffffffffffffbf0),
                       (Message *)in_stack_fffffffffffffbe8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)BVar4.bounds);
            std::__cxx11::string::~string(local_340);
            testing::Message::~Message((Message *)0x5c14d3);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c1564);
          if (bVar1) goto LAB_005c17be;
          in_stack_fffffffffffffb98 =
               (allocator_type *)
               __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(local_2d0);
          in_stack_fffffffffffffba0 =
               (Tuple2<pbrt::Point2,_int>)pbrt::Bounds2iIterator::operator*(&local_2e0);
          in_stack_fffffffffffffc9c = in_stack_fffffffffffffba0.x;
          in_stack_fffffffffffffca0 = in_stack_fffffffffffffba0.y;
          in_stack_fffffffffffffb94 = local_2f4;
          pbrt::WrapMode2D::WrapMode2D
                    ((WrapMode2D *)in_stack_fffffffffffffb80,
                     BVar4.p.super_Tuple2<pbrt::Point2,_int>.y);
          p_00.super_Tuple2<pbrt::Point2,_int>.y = iVar8;
          p_00.super_Tuple2<pbrt::Point2,_int>.x = iVar7;
          wrapMode.wrap.values[1] = WVar6;
          wrapMode.wrap.values[0] = WVar5;
          in_stack_fffffffffffffb90 =
               pbrt::Image::GetChannel
                         (in_stack_fffffffffffffbe8,p_00,in_stack_fffffffffffffbe4,wrapMode);
          in_stack_fffffffffffffca4 = in_stack_fffffffffffffb90;
          testing::internal::EqHelper<false>::Compare<float,float>
                    ((char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                     (char *)in_stack_fffffffffffffb80,
                     (float *)BVar4.p.super_Tuple2<pbrt::Point2,_int>.
                              super_Tuple2<pbrt::Point2,_int>,(float *)BVar4.bounds);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffca8);
          in_stack_fffffffffffffb8c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb8c);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffba0);
            in_stack_fffffffffffffb80 =
                 (Bounds2iIterator *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x5c1692);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffba0,
                       (Type)((ulong)in_stack_fffffffffffffb98 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffb8c,(char *)in_stack_fffffffffffffb80);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)CONCAT44(WVar5,in_stack_fffffffffffffbf0),
                       (Message *)in_stack_fffffffffffffbe8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)BVar4.bounds);
            testing::Message::~Message((Message *)0x5c16ef);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c1744);
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator++(local_2d0);
        }
        BVar4 = pbrt::Bounds2iIterator::operator++((Bounds2iIterator *)in_stack_fffffffffffffb68);
        BVar9 = BVar4;
      }
      bVar1 = false;
LAB_005c17be:
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffb80);
      pbrt::Image::~Image((Image *)BVar4.bounds);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb80);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
                ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)BVar4.bounds);
      if (bVar1) {
        return;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

TEST(Image, CopyRectOut) {
    Point2i res(29, 14);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        // for (int nc : { 1, 3 }) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);

            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(2, 3), Point2i(5, 10));
            std::vector<float> buf(extent.Area() * nc);

            image.CopyRectOut(extent, pstd::MakeSpan(buf));

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    EXPECT_EQ(*bufIter, image.GetChannel(*pIter, c));
                    ++bufIter;
                }
            }
        }
    }
}